

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txindex_tests.cpp
# Opt level: O0

void __thiscall txindex_tests::txindex_initial_sync::test_method(txindex_initial_sync *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  CTransaction *txn_3;
  CBlock *block;
  int i;
  shared_ptr<const_CTransaction> *txn_2;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *__range1_2;
  shared_ptr<const_CTransaction> *txn_1;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *__range1_1;
  CBlock *genesis_block;
  shared_ptr<const_CTransaction> *txn;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *__range1;
  vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> no_txns;
  iterator __end1_2;
  iterator __begin1_2;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  iterator __end1;
  iterator __begin1;
  CTransactionRef tx_disk;
  CScript coinbase_script_pub_key;
  uint256 block_hash;
  TxIndex txindex;
  CChainParams *in_stack_fffffffffffff6c8;
  undefined7 in_stack_fffffffffffff6d0;
  undefined1 in_stack_fffffffffffff6d7;
  undefined7 in_stack_fffffffffffff6d8;
  undefined1 in_stack_fffffffffffff6df;
  lazy_ostream *in_stack_fffffffffffff6e0;
  char *in_stack_fffffffffffff6e8;
  undefined7 in_stack_fffffffffffff6f0;
  undefined1 in_stack_fffffffffffff6f7;
  TxIndex *in_stack_fffffffffffff6f8;
  const_string *in_stack_fffffffffffff700;
  undefined7 in_stack_fffffffffffff708;
  undefined1 in_stack_fffffffffffff70f;
  lazy_ostream *in_stack_fffffffffffff710;
  vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *in_stack_fffffffffffff718;
  undefined7 in_stack_fffffffffffff720;
  undefined1 in_stack_fffffffffffff727;
  BaseIndex *in_stack_fffffffffffff740;
  undefined7 in_stack_fffffffffffff780;
  undefined1 in_stack_fffffffffffff787;
  Txid *in_stack_fffffffffffff788;
  Txid *in_stack_fffffffffffff790;
  undefined7 in_stack_fffffffffffff798;
  undefined1 in_stack_fffffffffffff79f;
  int local_73c;
  const_string local_6e8;
  lazy_ostream local_6d8 [2];
  assertion_result local_6b8 [2];
  const_string local_680;
  lazy_ostream local_670 [2];
  assertion_result local_650 [2];
  const_string local_618 [2];
  lazy_ostream local_5f8 [2];
  assertion_result local_5d8 [3];
  const_string local_588;
  lazy_ostream local_578 [2];
  assertion_result local_558 [2];
  const_string local_520;
  lazy_ostream local_510 [2];
  assertion_result local_4f0 [2];
  shared_ptr<const_CTransaction> *local_4b8;
  shared_ptr<const_CTransaction> *local_4b0;
  const_string local_4a8 [2];
  lazy_ostream local_488 [2];
  assertion_result local_468 [2];
  shared_ptr<const_CTransaction> *local_430;
  shared_ptr<const_CTransaction> *local_428;
  const_string local_420 [2];
  lazy_ostream local_400 [2];
  assertion_result local_3e0 [2];
  const_string local_3a8 [2];
  lazy_ostream local_388 [2];
  assertion_result local_368 [2];
  const_string local_330 [2];
  lazy_ostream local_310 [2];
  assertion_result local_2f0 [2];
  shared_ptr<const_CTransaction> *local_2b8;
  shared_ptr<const_CTransaction> *local_2b0;
  const_string local_298 [2];
  lazy_ostream local_278 [2];
  assertion_result local_258 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  interfaces::MakeChain
            ((NodeContext *)CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8));
  TxIndex::TxIndex(in_stack_fffffffffffff6f8,
                   (unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)
                   CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
                   (size_t)in_stack_fffffffffffff718,
                   SUB81((ulong)in_stack_fffffffffffff710 >> 0x38,0),
                   SUB81((ulong)in_stack_fffffffffffff710 >> 0x30,0));
  std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>::~unique_ptr
            ((unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)
             CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8),
               (pointer)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
               (unsigned_long)in_stack_fffffffffffff6c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708),
               in_stack_fffffffffffff700,(size_t)in_stack_fffffffffffff6f8,
               (const_string *)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0));
    BaseIndex::Init((BaseIndex *)CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8),
               (bool)in_stack_fffffffffffff6d7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8),
               (pointer)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
               (unsigned_long)in_stack_fffffffffffff6c8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff6c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8),
               (pointer)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
               (unsigned_long)in_stack_fffffffffffff6c8);
    in_stack_fffffffffffff6c8 = (CChainParams *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_258,local_278,local_298,0x14,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff6c8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff6c8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffff6c8);
  uint256::uint256((uint256 *)in_stack_fffffffffffff6c8);
  local_2b0 = (shared_ptr<const_CTransaction> *)
              std::
              vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ::begin((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                       *)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
  local_2b8 = (shared_ptr<const_CTransaction> *)
              std::
              vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ::end((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                     *)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
  while (bVar1 = __gnu_cxx::
                 operator==<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                           ((__normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                             *)CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8),
                            (__normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                             *)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0)),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
    ::operator*((__normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                 *)in_stack_fffffffffffff6c8);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8),
                 (pointer)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
                 (unsigned_long)in_stack_fffffffffffff6c8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff6c8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708),
                 in_stack_fffffffffffff700,(size_t)in_stack_fffffffffffff6f8,
                 (const_string *)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0));
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffff6c8);
      CTransaction::GetHash((CTransaction *)in_stack_fffffffffffff6c8);
      transaction_identifier::operator_cast_to_uint256_
                ((transaction_identifier<false> *)in_stack_fffffffffffff6c8);
      TxIndex::FindTx((TxIndex *)CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798),
                      &in_stack_fffffffffffff790->m_wrapped,&in_stack_fffffffffffff788->m_wrapped,
                      (CTransactionRef *)
                      CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8),
                 (bool)in_stack_fffffffffffff6d7);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8),
                 (pointer)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
                 (unsigned_long)in_stack_fffffffffffff6c8);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
                 (basic_cstring<const_char> *)in_stack_fffffffffffff6c8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8),
                 (pointer)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
                 (unsigned_long)in_stack_fffffffffffff6c8);
      in_stack_fffffffffffff6c8 = (CChainParams *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_2f0,local_310,local_330,0x1b,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffff6c8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff6c8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
    ::operator++((__normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                  *)in_stack_fffffffffffff6c8);
  }
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8),
               (pointer)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
               (unsigned_long)in_stack_fffffffffffff6c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708),
               in_stack_fffffffffffff700,(size_t)in_stack_fffffffffffff6f8,
               (const_string *)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0));
    BaseIndex::BlockUntilSyncedToCurrentChain(in_stack_fffffffffffff740);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8),
               (bool)in_stack_fffffffffffff6d7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8),
               (pointer)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
               (unsigned_long)in_stack_fffffffffffff6c8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff6c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8),
               (pointer)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
               (unsigned_long)in_stack_fffffffffffff6c8);
    in_stack_fffffffffffff6c8 = (CChainParams *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_368,local_388,local_3a8,0x1f,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff6c8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff6c8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8),
               (pointer)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
               (unsigned_long)in_stack_fffffffffffff6c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff6c8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708),
               in_stack_fffffffffffff700,(size_t)in_stack_fffffffffffff6f8,
               (const_string *)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0));
    BaseIndex::StartBackgroundSync
              ((BaseIndex *)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8),
               (bool)in_stack_fffffffffffff6d7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8),
               (pointer)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
               (unsigned_long)in_stack_fffffffffffff6c8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff6c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8),
               (pointer)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
               (unsigned_long)in_stack_fffffffffffff6c8);
    in_stack_fffffffffffff6c8 = (CChainParams *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3e0,local_400,local_420,0x21,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff6c8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff6c8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  inline_assertion_check<true,util::SignalInterrupt*&>
            ((SignalInterrupt **)CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708),
             (char *)in_stack_fffffffffffff700,(int)((ulong)in_stack_fffffffffffff6f8 >> 0x20),
             (char *)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),
             in_stack_fffffffffffff6e8);
  IndexWaitSynced((BaseIndex *)in_stack_fffffffffffff6c8,(SignalInterrupt *)0xb5a1d4);
  Params();
  CChainParams::GenesisBlock(in_stack_fffffffffffff6c8);
  local_428 = (shared_ptr<const_CTransaction> *)
              std::
              vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ::begin((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                       *)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
  local_430 = (shared_ptr<const_CTransaction> *)
              std::
              vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ::end((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                     *)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
  while (bVar1 = __gnu_cxx::
                 operator==<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                           ((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                             *)CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8),
                            (__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                             *)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0)),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
    ::operator*((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                 *)in_stack_fffffffffffff6c8);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8),
                 (pointer)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
                 (unsigned_long)in_stack_fffffffffffff6c8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff6c8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708),
                 in_stack_fffffffffffff700,(size_t)in_stack_fffffffffffff6f8,
                 (const_string *)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0));
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffff6c8);
      CTransaction::GetHash((CTransaction *)in_stack_fffffffffffff6c8);
      transaction_identifier::operator_cast_to_uint256_
                ((transaction_identifier<false> *)in_stack_fffffffffffff6c8);
      TxIndex::FindTx((TxIndex *)CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798),
                      &in_stack_fffffffffffff790->m_wrapped,&in_stack_fffffffffffff788->m_wrapped,
                      (CTransactionRef *)
                      CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8),
                 (bool)in_stack_fffffffffffff6d7);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8),
                 (pointer)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
                 (unsigned_long)in_stack_fffffffffffff6c8);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
                 (basic_cstring<const_char> *)in_stack_fffffffffffff6c8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8),
                 (pointer)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
                 (unsigned_long)in_stack_fffffffffffff6c8);
      in_stack_fffffffffffff6c8 = (CChainParams *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_468,local_488,local_4a8,0x29,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffff6c8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff6c8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
    ::operator++((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                  *)in_stack_fffffffffffff6c8);
  }
  local_4b0 = (shared_ptr<const_CTransaction> *)
              std::
              vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ::begin((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                       *)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
  local_4b8 = (shared_ptr<const_CTransaction> *)
              std::
              vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ::end((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                     *)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
  while (bVar1 = __gnu_cxx::
                 operator==<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                           ((__normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                             *)CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8),
                            (__normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                             *)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0)),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
    ::operator*((__normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                 *)in_stack_fffffffffffff6c8);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffff6c8);
    CTransaction::GetHash((CTransaction *)in_stack_fffffffffffff6c8);
    transaction_identifier::operator_cast_to_uint256_
              ((transaction_identifier<false> *)in_stack_fffffffffffff6c8);
    bVar1 = TxIndex::FindTx((TxIndex *)CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798)
                            ,&in_stack_fffffffffffff790->m_wrapped,
                            &in_stack_fffffffffffff788->m_wrapped,
                            (CTransactionRef *)
                            CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780));
    if (bVar1) {
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffff6c8);
      in_stack_fffffffffffff790 = CTransaction::GetHash((CTransaction *)in_stack_fffffffffffff6c8);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffff6c8);
      in_stack_fffffffffffff788 = CTransaction::GetHash((CTransaction *)in_stack_fffffffffffff6c8);
      in_stack_fffffffffffff787 =
           transaction_identifier<false>::operator!=
                     ((transaction_identifier<false> *)
                      CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8),
                      (transaction_identifier<false> *)
                      CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
      if ((bool)in_stack_fffffffffffff787) {
        do {
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)
                     CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8),
                     (pointer)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
                     (unsigned_long)in_stack_fffffffffffff6c8);
          boost::unit_test::basic_cstring<const_char>::basic_cstring
                    ((basic_cstring<const_char> *)in_stack_fffffffffffff6c8);
          boost::unit_test::unit_test_log_t::set_checkpoint
                    ((unit_test_log_t *)
                     CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708),
                     in_stack_fffffffffffff700,(size_t)in_stack_fffffffffffff6f8,
                     (const_string *)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0));
          boost::test_tools::assertion_result::assertion_result
                    ((assertion_result *)
                     CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8),
                     (bool)in_stack_fffffffffffff6d7);
          boost::unit_test::lazy_ostream::instance();
          boost::unit_test::operator<<
                    ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
                     (char (*) [18])in_stack_fffffffffffff6c8);
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)
                     CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8),
                     (pointer)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
                     (unsigned_long)in_stack_fffffffffffff6c8);
          in_stack_fffffffffffff6c8 = (CChainParams *)0x0;
          boost::test_tools::tt_detail::report_assertion(local_558,local_578,&local_588,0x31,CHECK);
          boost::unit_test::
          lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[18],_const_char_(&)[18]>::
          ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[18],_const_char_(&)[18]>
                              *)in_stack_fffffffffffff6c8);
          boost::test_tools::assertion_result::~assertion_result
                    ((assertion_result *)in_stack_fffffffffffff6c8);
          bVar1 = boost::test_tools::tt_detail::dummy_cond();
        } while (bVar1);
      }
    }
    else {
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)
                   CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8),
                   (pointer)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
                   (unsigned_long)in_stack_fffffffffffff6c8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff6c8);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708),
                   in_stack_fffffffffffff700,(size_t)in_stack_fffffffffffff6f8,
                   (const_string *)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0));
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8)
                   ,(bool)in_stack_fffffffffffff6d7);
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::operator<<
                  ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
                   (char (*) [14])in_stack_fffffffffffff6c8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)
                   CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8),
                   (pointer)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
                   (unsigned_long)in_stack_fffffffffffff6c8);
        in_stack_fffffffffffff6c8 = (CChainParams *)0x0;
        boost::test_tools::tt_detail::report_assertion(local_4f0,local_510,&local_520,0x2f,CHECK);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[14],_const_char_(&)[14]>::
        ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[14],_const_char_(&)[14]>
                            *)in_stack_fffffffffffff6c8);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_fffffffffffff6c8);
        in_stack_fffffffffffff79f = boost::test_tools::tt_detail::dummy_cond();
      } while ((bool)in_stack_fffffffffffff79f);
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
    ::operator++((__normal_iterator<std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                  *)in_stack_fffffffffffff6c8);
  }
  for (local_73c = 0; local_73c < 10; local_73c = local_73c + 1) {
    CKey::GetPubKey((CKey *)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0));
    PKHash::PKHash((PKHash *)in_stack_fffffffffffff6e0,
                   (CPubKey *)CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8));
    std::
    variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
    ::variant<PKHash,void,void,PKHash,void>
              ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                *)CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8),
               (PKHash *)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
    GetScriptForDestination((CTxDestination *)in_stack_fffffffffffff6c8);
    std::
    variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                *)in_stack_fffffffffffff6c8);
    std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::vector
              ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)
               in_stack_fffffffffffff6c8);
    TestChain100Setup::CreateAndProcessBlock
              ((TestChain100Setup *)CONCAT17(in_stack_fffffffffffff727,in_stack_fffffffffffff720),
               in_stack_fffffffffffff718,(CScript *)in_stack_fffffffffffff710,
               (Chainstate *)CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708));
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8),
                 CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator*((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8));
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8),
                 (pointer)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
                 (unsigned_long)in_stack_fffffffffffff6c8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff6c8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708),
                 in_stack_fffffffffffff700,(size_t)in_stack_fffffffffffff6f8,
                 (const_string *)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0));
      BaseIndex::BlockUntilSyncedToCurrentChain(in_stack_fffffffffffff740);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8),
                 (bool)in_stack_fffffffffffff6d7);
      in_stack_fffffffffffff740 = (BaseIndex *)boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8),
                 (pointer)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
                 (unsigned_long)in_stack_fffffffffffff6c8);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
                 (basic_cstring<const_char> *)in_stack_fffffffffffff6c8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8),
                 (pointer)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
                 (unsigned_long)in_stack_fffffffffffff6c8);
      in_stack_fffffffffffff6c8 = (CChainParams *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_5d8,local_5f8,local_618,0x3c,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffff6c8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff6c8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    CTransaction::GetHash((CTransaction *)in_stack_fffffffffffff6c8);
    transaction_identifier::operator_cast_to_uint256_
              ((transaction_identifier<false> *)in_stack_fffffffffffff6c8);
    in_stack_fffffffffffff727 =
         TxIndex::FindTx((TxIndex *)CONCAT17(in_stack_fffffffffffff79f,in_stack_fffffffffffff798),
                         &in_stack_fffffffffffff790->m_wrapped,&in_stack_fffffffffffff788->m_wrapped
                         ,(CTransactionRef *)
                          CONCAT17(in_stack_fffffffffffff787,in_stack_fffffffffffff780));
    if ((bool)in_stack_fffffffffffff727) {
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffff6c8);
      in_stack_fffffffffffff700 =
           (const_string *)CTransaction::GetHash((CTransaction *)in_stack_fffffffffffff6c8);
      in_stack_fffffffffffff6f8 =
           (TxIndex *)CTransaction::GetHash((CTransaction *)in_stack_fffffffffffff6c8);
      in_stack_fffffffffffff6f7 =
           transaction_identifier<false>::operator!=
                     ((transaction_identifier<false> *)
                      CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8),
                      (transaction_identifier<false> *)
                      CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
      if ((bool)in_stack_fffffffffffff6f7) {
        do {
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)
                     CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8),
                     (pointer)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
                     (unsigned_long)in_stack_fffffffffffff6c8);
          boost::unit_test::basic_cstring<const_char>::basic_cstring
                    ((basic_cstring<const_char> *)in_stack_fffffffffffff6c8);
          boost::unit_test::unit_test_log_t::set_checkpoint
                    ((unit_test_log_t *)
                     CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708),
                     in_stack_fffffffffffff700,(size_t)in_stack_fffffffffffff6f8,
                     (const_string *)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0));
          boost::test_tools::assertion_result::assertion_result
                    ((assertion_result *)
                     CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8),
                     (bool)in_stack_fffffffffffff6d7);
          in_stack_fffffffffffff6e0 = boost::unit_test::lazy_ostream::instance();
          boost::unit_test::operator<<
                    ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
                     (char (*) [18])in_stack_fffffffffffff6c8);
          boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                    ((basic_cstring<const_char> *)
                     CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8),
                     (pointer)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
                     (unsigned_long)in_stack_fffffffffffff6c8);
          in_stack_fffffffffffff6c8 = (CChainParams *)0x0;
          boost::test_tools::tt_detail::report_assertion(local_6b8,local_6d8,&local_6e8,0x40,CHECK);
          boost::unit_test::
          lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[18],_const_char_(&)[18]>::
          ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[18],_const_char_(&)[18]>
                              *)in_stack_fffffffffffff6c8);
          boost::test_tools::assertion_result::~assertion_result
                    ((assertion_result *)in_stack_fffffffffffff6c8);
          in_stack_fffffffffffff6df = boost::test_tools::tt_detail::dummy_cond();
        } while ((bool)in_stack_fffffffffffff6df);
      }
    }
    else {
      do {
        in_stack_fffffffffffff718 = boost::unit_test::(anonymous_namespace)::unit_test_log;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)
                   CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8),
                   (pointer)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
                   (unsigned_long)in_stack_fffffffffffff6c8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffff6c8);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff70f,in_stack_fffffffffffff708),
                   in_stack_fffffffffffff700,(size_t)in_stack_fffffffffffff6f8,
                   (const_string *)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0));
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8)
                   ,(bool)in_stack_fffffffffffff6d7);
        in_stack_fffffffffffff710 = boost::unit_test::lazy_ostream::instance();
        boost::unit_test::operator<<
                  ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
                   (char (*) [14])in_stack_fffffffffffff6c8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)
                   CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8),
                   (pointer)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
                   (unsigned_long)in_stack_fffffffffffff6c8);
        in_stack_fffffffffffff6c8 = (CChainParams *)0x0;
        boost::test_tools::tt_detail::report_assertion(local_650,local_670,&local_680,0x3e,CHECK);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[14],_const_char_(&)[14]>::
        ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[14],_const_char_(&)[14]>
                            *)in_stack_fffffffffffff6c8);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_fffffffffffff6c8);
        in_stack_fffffffffffff70f = boost::test_tools::tt_detail::dummy_cond();
      } while ((bool)in_stack_fffffffffffff70f);
    }
    CBlock::~CBlock((CBlock *)in_stack_fffffffffffff6c8);
    std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::~vector
              ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)
               CONCAT17(in_stack_fffffffffffff6df,in_stack_fffffffffffff6d8));
    CScript::~CScript((CScript *)in_stack_fffffffffffff6c8);
  }
  std::unique_ptr<ValidationSignals,_std::default_delete<ValidationSignals>_>::operator->
            ((unique_ptr<ValidationSignals,_std::default_delete<ValidationSignals>_> *)
             in_stack_fffffffffffff6c8);
  ValidationSignals::SyncWithValidationInterfaceQueue
            ((ValidationSignals *)in_stack_fffffffffffff6f8);
  BaseIndex::Stop((BaseIndex *)in_stack_fffffffffffff6c8);
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffff6c8);
  TxIndex::~TxIndex((TxIndex *)in_stack_fffffffffffff6c8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_FIXTURE_TEST_CASE(txindex_initial_sync, TestChain100Setup)
{
    TxIndex txindex(interfaces::MakeChain(m_node), 1 << 20, true);
    BOOST_REQUIRE(txindex.Init());

    CTransactionRef tx_disk;
    uint256 block_hash;

    // Transaction should not be found in the index before it is started.
    for (const auto& txn : m_coinbase_txns) {
        BOOST_CHECK(!txindex.FindTx(txn->GetHash(), block_hash, tx_disk));
    }

    // BlockUntilSyncedToCurrentChain should return false before txindex is started.
    BOOST_CHECK(!txindex.BlockUntilSyncedToCurrentChain());

    BOOST_REQUIRE(txindex.StartBackgroundSync());

    // Allow tx index to catch up with the block index.
    IndexWaitSynced(txindex, *Assert(m_node.shutdown));

    // Check that txindex excludes genesis block transactions.
    const CBlock& genesis_block = Params().GenesisBlock();
    for (const auto& txn : genesis_block.vtx) {
        BOOST_CHECK(!txindex.FindTx(txn->GetHash(), block_hash, tx_disk));
    }

    // Check that txindex has all txs that were in the chain before it started.
    for (const auto& txn : m_coinbase_txns) {
        if (!txindex.FindTx(txn->GetHash(), block_hash, tx_disk)) {
            BOOST_ERROR("FindTx failed");
        } else if (tx_disk->GetHash() != txn->GetHash()) {
            BOOST_ERROR("Read incorrect tx");
        }
    }

    // Check that new transactions in new blocks make it into the index.
    for (int i = 0; i < 10; i++) {
        CScript coinbase_script_pub_key = GetScriptForDestination(PKHash(coinbaseKey.GetPubKey()));
        std::vector<CMutableTransaction> no_txns;
        const CBlock& block = CreateAndProcessBlock(no_txns, coinbase_script_pub_key);
        const CTransaction& txn = *block.vtx[0];

        BOOST_CHECK(txindex.BlockUntilSyncedToCurrentChain());
        if (!txindex.FindTx(txn.GetHash(), block_hash, tx_disk)) {
            BOOST_ERROR("FindTx failed");
        } else if (tx_disk->GetHash() != txn.GetHash()) {
            BOOST_ERROR("Read incorrect tx");
        }
    }

    // It is not safe to stop and destroy the index until it finishes handling
    // the last BlockConnected notification. The BlockUntilSyncedToCurrentChain()
    // call above is sufficient to ensure this, but the
    // SyncWithValidationInterfaceQueue() call below is also needed to ensure
    // TSAN always sees the test thread waiting for the notification thread, and
    // avoid potential false positive reports.
    m_node.validation_signals->SyncWithValidationInterfaceQueue();

    // shutdown sequence (c.f. Shutdown() in init.cpp)
    txindex.Stop();
}